

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::texcoord2h> * __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::texcoord2h>
          (optional<tinyusdz::value::texcoord2h> *__return_storage_ptr__,Attribute *this)

{
  optional<tinyusdz::value::texcoord2h> local_1e;
  Attribute *local_18;
  Attribute *this_local;
  
  local_18 = this;
  this_local = (Attribute *)__return_storage_ptr__;
  primvar::PrimVar::get_value<tinyusdz::value::texcoord2h>(&local_1e,&this->_var);
  nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::
  optional<tinyusdz::value::texcoord2h,_0>(__return_storage_ptr__,&local_1e);
  nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::~optional(&local_1e);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }